

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O0

void __thiscall dbwrapper_tests::dbwrapper_basic_data::test_method(dbwrapper_basic_data *this)

{
  long lVar1;
  bool bVar2;
  const_iterator pbVar3;
  uint64_t uVar4;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffed58;
  ArgsManager *in_stack_ffffffffffffed60;
  char *in_stack_ffffffffffffed68;
  undefined4 in_stack_ffffffffffffed70;
  int in_stack_ffffffffffffed74;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffed78;
  undefined7 in_stack_ffffffffffffed80;
  undefined1 in_stack_ffffffffffffed87;
  lazy_ostream *in_stack_ffffffffffffed88;
  CDBWrapper *in_stack_ffffffffffffed90;
  undefined7 in_stack_ffffffffffffed98;
  undefined1 in_stack_ffffffffffffed9f;
  CDBWrapper *in_stack_ffffffffffffeda0;
  undefined7 in_stack_ffffffffffffeda8;
  undefined1 in_stack_ffffffffffffedaf;
  CDBWrapper *in_stack_ffffffffffffedb0;
  CDBWrapper *this_00;
  DBParams *in_stack_ffffffffffffeeb8;
  undefined7 in_stack_ffffffffffffeec0;
  undefined1 in_stack_ffffffffffffeec7;
  bool obfuscate;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<bool> *__range1;
  dbwrapper_basic_data *this_local;
  undefined1 local_f20 [16];
  undefined1 local_f10 [64];
  const_string local_ed0 [2];
  lazy_ostream local_eb0 [2];
  assertion_result local_e90 [2];
  const_string local_e58 [2];
  lazy_ostream local_e38 [2];
  assertion_result local_e18 [2];
  bool in_file_bool;
  undefined1 local_ddb;
  uint8_t filename_length;
  allocator<char> local_dd9;
  undefined1 local_dd8 [16];
  undefined1 local_dc8 [64];
  const_string local_d88 [2];
  lazy_ostream local_d68 [2];
  assertion_result local_d48 [2];
  const_string local_d10 [2];
  lazy_ostream local_cf0 [2];
  assertion_result local_cd0 [2];
  uint8_t key_lastblockhash_uxto;
  undefined1 local_c90 [16];
  undefined1 local_c80 [64];
  const_string local_c40 [2];
  lazy_ostream local_c20 [2];
  assertion_result local_c00 [2];
  const_string local_bc8 [2];
  lazy_ostream local_ba8 [2];
  assertion_result local_b88 [2];
  bool isInReindexing;
  uint8_t key_IsReindexing;
  undefined1 local_b48 [16];
  undefined1 local_b38 [64];
  const_string local_af8 [2];
  lazy_ostream local_ad8 [2];
  assertion_result local_ab8 [2];
  const_string local_a80 [2];
  lazy_ostream local_a60 [2];
  assertion_result local_a40 [2];
  uint32_t lastblockfilenumber;
  uint8_t key_last_blockfile_number;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [64];
  const_string local_9b0 [2];
  lazy_ostream local_990 [2];
  assertion_result local_970 [2];
  const_string local_938 [2];
  lazy_ostream local_918 [2];
  assertion_result local_8f8 [2];
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [64];
  const_string local_870 [2];
  lazy_ostream local_850 [2];
  assertion_result local_830 [2];
  const_string local_7f8 [2];
  lazy_ostream local_7d8 [2];
  assertion_result local_7b8 [2];
  undefined1 local_780 [16];
  undefined1 local_770 [64];
  const_string local_730 [2];
  lazy_ostream local_710 [2];
  assertion_result local_6f0 [2];
  const_string local_6b8 [2];
  lazy_ostream local_698 [2];
  assertion_result local_678 [2];
  uint32_t local_63c;
  undefined1 local_638 [16];
  undefined1 local_628 [64];
  const_string local_5e8 [2];
  lazy_ostream local_5c8 [2];
  assertion_result local_5a8 [2];
  const_string local_570 [2];
  lazy_ostream local_550 [2];
  assertion_result local_530 [2];
  const_string local_4f8 [2];
  lazy_ostream local_4d8 [2];
  assertion_result local_4b8 [2];
  bool res_bool;
  uint32_t res_uint_32;
  undefined8 local_478;
  undefined8 local_470;
  undefined1 local_462 [2];
  string key_file_option;
  string filename;
  string file_option_tag;
  uint256 lastblock_hash;
  undefined1 local_3e0 [64];
  uint256 in_utxo;
  string key_utxo;
  undefined1 local_300 [32];
  uint256 in_transaction;
  string key_transaction;
  undefined1 local_260 [64];
  uint256 in_file_info;
  string key_file;
  undefined1 local_1c0 [32];
  uint256 in_block;
  string key_block;
  uint256 res;
  CDBWrapper dbw;
  path ph;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_462[0] = '\0';
  local_462[1] = '\x01';
  local_478 = local_462;
  local_470 = 2;
  __begin1 = std::initializer_list<bool>::begin((initializer_list<bool> *)in_stack_ffffffffffffed58)
  ;
  pbVar3 = std::initializer_list<bool>::end((initializer_list<bool> *)in_stack_ffffffffffffed68);
  for (; __begin1 != pbVar3; __begin1 = __begin1 + 1) {
    ArgsManager::GetDataDirBase(in_stack_ffffffffffffed60);
    fs::operator/((path *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                  in_stack_ffffffffffffed68);
    fs::path::~path((path *)in_stack_ffffffffffffed58);
    fs::path::path((path *)in_stack_ffffffffffffed58,(path *)0x5a3eab);
    CDBWrapper::CDBWrapper
              ((CDBWrapper *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
               in_stack_ffffffffffffeeb8);
    DBParams::~DBParams((DBParams *)in_stack_ffffffffffffed58);
    uint256::uint256((uint256 *)in_stack_ffffffffffffed58);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      dbwrapper_private::GetObfuscateKey((CDBWrapper *)in_stack_ffffffffffffed58);
      is_null_key((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffed68
                 );
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_4b8,local_4d8,local_4f8,0x3c,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffed88);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffed60);
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffed68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed58);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffed88);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Write<std::__cxx11::string,uint256>
                (in_stack_ffffffffffffeda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (uint256 *)in_stack_ffffffffffffed90,
                 SUB81((ulong)in_stack_ffffffffffffed88 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_530,local_550,local_570,0x42,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Read<std::__cxx11::string,uint256>
                (in_stack_ffffffffffffedb0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
                 (uint256 *)in_stack_ffffffffffffeda0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_5a8,local_5c8,local_5e8,0x43,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,(char (*) [1])in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffed60);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffed60);
      in_stack_ffffffffffffed68 = "in_block.ToString()";
      in_stack_ffffffffffffed60 = (ArgsManager *)&stack0xfffffffffffffe20;
      in_stack_ffffffffffffed58 = "res.ToString()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_628,local_638,0x44,1,2,local_1c0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffed58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffed58);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    local_63c = RandomMixin<FastRandomContext>::rand32
                          ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffed58);
    tinyformat::format<unsigned_int>
              ((char *)in_stack_ffffffffffffed88,
               (uint *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffed88);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Write<std::__cxx11::string,uint256>
                (in_stack_ffffffffffffeda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (uint256 *)in_stack_ffffffffffffed90,
                 SUB81((ulong)in_stack_ffffffffffffed88 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_678,local_698,local_6b8,0x4a,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Read<std::__cxx11::string,uint256>
                (in_stack_ffffffffffffedb0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
                 (uint256 *)in_stack_ffffffffffffeda0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_6f0,local_710,local_730,0x4b,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,(char (*) [1])in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffed60);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffed60);
      in_stack_ffffffffffffed68 = "in_file_info.ToString()";
      in_stack_ffffffffffffed60 = (ArgsManager *)local_260;
      in_stack_ffffffffffffed58 = "res.ToString()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_770,local_780,0x4c,1,2,local_260 + 0x20);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffed58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffed58);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffed88);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffed60);
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffed68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed58);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffed88);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Write<std::__cxx11::string,uint256>
                (in_stack_ffffffffffffeda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (uint256 *)in_stack_ffffffffffffed90,
                 SUB81((ulong)in_stack_ffffffffffffed88 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_7b8,local_7d8,local_7f8,0x52,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Read<std::__cxx11::string,uint256>
                (in_stack_ffffffffffffedb0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
                 (uint256 *)in_stack_ffffffffffffeda0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_830,local_850,local_870,0x53,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,(char (*) [1])in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffed60);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffed60);
      in_stack_ffffffffffffed68 = "in_transaction.ToString()";
      in_stack_ffffffffffffed60 = (ArgsManager *)&stack0xfffffffffffffce0;
      in_stack_ffffffffffffed58 = "res.ToString()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_8b0,local_8c0,0x54,1,2,local_300);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffed58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffed58);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffed88);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffed60);
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffed68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed58);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffed88);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Write<std::__cxx11::string,uint256>
                (in_stack_ffffffffffffeda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (uint256 *)in_stack_ffffffffffffed90,
                 SUB81((ulong)in_stack_ffffffffffffed88 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_8f8,local_918,local_938,0x5a,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Read<std::__cxx11::string,uint256>
                (in_stack_ffffffffffffedb0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
                 (uint256 *)in_stack_ffffffffffffeda0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_970,local_990,local_9b0,0x5b,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,(char (*) [1])in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffed60);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffed60);
      in_stack_ffffffffffffed68 = "in_utxo.ToString()";
      in_stack_ffffffffffffed60 = (ArgsManager *)local_3e0;
      in_stack_ffffffffffffed58 = "res.ToString()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_9f0,local_a00,0x5c,1,2,local_3e0 + 0x20);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffed58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffed58);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    key_last_blockfile_number = 'l';
    lastblockfilenumber =
         RandomMixin<FastRandomContext>::rand32
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffed58);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Write<unsigned_char,unsigned_int>
                (in_stack_ffffffffffffeda0,
                 (uchar *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (uint *)in_stack_ffffffffffffed90,SUB81((ulong)in_stack_ffffffffffffed88 >> 0x38,0)
                );
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_a40,local_a60,local_a80,0x61,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      in_stack_ffffffffffffeec7 =
           CDBWrapper::Read<unsigned_char,unsigned_int>
                     (in_stack_ffffffffffffedb0,
                      (uchar *)CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
                      (uint *)in_stack_ffffffffffffeda0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      in_stack_ffffffffffffeeb8 = (DBParams *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_ab8,local_ad8,local_af8,0x62,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,(char (*) [1])in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed68 = "res_uint_32";
      in_stack_ffffffffffffed60 = (ArgsManager *)&res_uint_32;
      in_stack_ffffffffffffed58 = "lastblockfilenumber";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
                (local_b38,local_b48,99,1,2,&lastblockfilenumber);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    key_IsReindexing = 'R';
    isInReindexing =
         RandomMixin<FastRandomContext>::randbool
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffed58);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Write<unsigned_char,bool>
                (in_stack_ffffffffffffeda0,
                 (uchar *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (bool *)in_stack_ffffffffffffed90,SUB81((ulong)in_stack_ffffffffffffed88 >> 0x38,0)
                );
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_b88,local_ba8,local_bc8,0x68,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Read<unsigned_char,bool>
                (in_stack_ffffffffffffedb0,
                 (uchar *)CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
                 (bool *)in_stack_ffffffffffffeda0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_c00,local_c20,local_c40,0x69,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,(char (*) [1])in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed68 = "res_bool";
      in_stack_ffffffffffffed60 = (ArgsManager *)&res_bool;
      in_stack_ffffffffffffed58 = "isInReindexing";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                (local_c80,local_c90,0x6a,1,2,&isInReindexing);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    key_lastblockhash_uxto = 'B';
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffed88);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Write<unsigned_char,uint256>
                (in_stack_ffffffffffffeda0,
                 (uchar *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (uint256 *)in_stack_ffffffffffffed90,
                 SUB81((ulong)in_stack_ffffffffffffed88 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_cd0,local_cf0,local_d10,0x6f,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Read<unsigned_char,uint256>
                (in_stack_ffffffffffffedb0,
                 (uchar *)CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
                 (uint256 *)in_stack_ffffffffffffeda0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_d48,local_d68,local_d88,0x70,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,(char (*) [1])in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed68 = "res";
      in_stack_ffffffffffffed60 = (ArgsManager *)&res;
      in_stack_ffffffffffffed58 = "lastblock_hash";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                (local_dc8,local_dd8,0x71,1,2,&lastblock_hash);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
               (char *)in_stack_ffffffffffffeda0,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98));
    std::allocator<char>::~allocator(&local_dd9);
    uVar4 = RandomMixin<FastRandomContext>::randbits
                      (in_stack_ffffffffffffed78,in_stack_ffffffffffffed74);
    filename_length = (uint8_t)uVar4;
    this_00 = (CDBWrapper *)&local_ddb;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
               (char *)in_stack_ffffffffffffeda0,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98));
    std::allocator<char>::~allocator((allocator<char> *)&local_ddb);
    tinyformat::format<std::__cxx11::string,unsigned_char,std::__cxx11::string>
              ((char *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed90,(uchar *)in_stack_ffffffffffffed88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
    in_file_bool = RandomMixin<FastRandomContext>::randbool
                             ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffed58);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      CDBWrapper::Write<std::__cxx11::string,bool>
                (in_stack_ffffffffffffeda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (bool *)in_stack_ffffffffffffed90,SUB81((ulong)in_stack_ffffffffffffed88 >> 0x38,0)
                );
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_e18,local_e38,local_e58,0x7a,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      in_stack_ffffffffffffedb0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      in_stack_ffffffffffffedaf =
           CDBWrapper::Read<std::__cxx11::string,bool>
                     (in_stack_ffffffffffffedb0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
                      (bool *)in_stack_ffffffffffffeda0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffed68,
                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
      in_stack_ffffffffffffeda0 = (CDBWrapper *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_e90,local_eb0,local_ed0,0x7b,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffed58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed9f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_ffffffffffffed9f);
    do {
      in_stack_ffffffffffffed90 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed9f,in_stack_ffffffffffffed98),
                 (const_string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffed87,in_stack_ffffffffffffed80));
      in_stack_ffffffffffffed88 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffed60,(char (*) [1])in_stack_ffffffffffffed58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffed68,
                 (pointer)in_stack_ffffffffffffed60,(unsigned_long)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed68 = "in_file_bool";
      in_stack_ffffffffffffed60 = (ArgsManager *)&in_file_bool;
      in_stack_ffffffffffffed58 = "res_bool";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                (local_f10,local_f20,0x7c,1,2);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed87 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_ffffffffffffed87);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed58);
    CDBWrapper::~CDBWrapper(this_00);
    fs::path::~path((path *)in_stack_ffffffffffffed58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(dbwrapper_basic_data)
{
    // Perform tests both obfuscated and non-obfuscated.
    for (bool obfuscate : {false, true}) {
        fs::path ph = m_args.GetDataDirBase() / (obfuscate ? "dbwrapper_1_obfuscate_true" : "dbwrapper_1_obfuscate_false");
        CDBWrapper dbw({.path = ph, .cache_bytes = 1 << 20, .memory_only = false, .wipe_data = true, .obfuscate = obfuscate});

        uint256 res;
        uint32_t res_uint_32;
        bool res_bool;

        // Ensure that we're doing real obfuscation when obfuscate=true
        BOOST_CHECK(obfuscate != is_null_key(dbwrapper_private::GetObfuscateKey(dbw)));

        //Simulate block raw data - "b + block hash"
        std::string key_block = "b" + m_rng.rand256().ToString();

        uint256 in_block = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_block, in_block));
        BOOST_CHECK(dbw.Read(key_block, res));
        BOOST_CHECK_EQUAL(res.ToString(), in_block.ToString());

        //Simulate file raw data - "f + file_number"
        std::string key_file = strprintf("f%04x", m_rng.rand32());

        uint256 in_file_info = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_file, in_file_info));
        BOOST_CHECK(dbw.Read(key_file, res));
        BOOST_CHECK_EQUAL(res.ToString(), in_file_info.ToString());

        //Simulate transaction raw data - "t + transaction hash"
        std::string key_transaction = "t" + m_rng.rand256().ToString();

        uint256 in_transaction = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_transaction, in_transaction));
        BOOST_CHECK(dbw.Read(key_transaction, res));
        BOOST_CHECK_EQUAL(res.ToString(), in_transaction.ToString());

        //Simulate UTXO raw data - "c + transaction hash"
        std::string key_utxo = "c" + m_rng.rand256().ToString();

        uint256 in_utxo = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_utxo, in_utxo));
        BOOST_CHECK(dbw.Read(key_utxo, res));
        BOOST_CHECK_EQUAL(res.ToString(), in_utxo.ToString());

        //Simulate last block file number - "l"
        uint8_t key_last_blockfile_number{'l'};
        uint32_t lastblockfilenumber = m_rng.rand32();
        BOOST_CHECK(dbw.Write(key_last_blockfile_number, lastblockfilenumber));
        BOOST_CHECK(dbw.Read(key_last_blockfile_number, res_uint_32));
        BOOST_CHECK_EQUAL(lastblockfilenumber, res_uint_32);

        //Simulate Is Reindexing - "R"
        uint8_t key_IsReindexing{'R'};
        bool isInReindexing = m_rng.randbool();
        BOOST_CHECK(dbw.Write(key_IsReindexing, isInReindexing));
        BOOST_CHECK(dbw.Read(key_IsReindexing, res_bool));
        BOOST_CHECK_EQUAL(isInReindexing, res_bool);

        //Simulate last block hash up to which UXTO covers - 'B'
        uint8_t key_lastblockhash_uxto{'B'};
        uint256 lastblock_hash = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_lastblockhash_uxto, lastblock_hash));
        BOOST_CHECK(dbw.Read(key_lastblockhash_uxto, res));
        BOOST_CHECK_EQUAL(lastblock_hash, res);

        //Simulate file raw data - "F + filename_number + filename"
        std::string file_option_tag = "F";
        uint8_t filename_length = m_rng.randbits(8);
        std::string filename = "randomfilename";
        std::string key_file_option = strprintf("%s%01x%s", file_option_tag,filename_length,filename);

        bool in_file_bool = m_rng.randbool();
        BOOST_CHECK(dbw.Write(key_file_option, in_file_bool));
        BOOST_CHECK(dbw.Read(key_file_option, res_bool));
        BOOST_CHECK_EQUAL(res_bool, in_file_bool);
   }
}